

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonengine.cpp
# Opt level: O3

void __thiscall banksia::JsonEngine::JsonEngine(JsonEngine *this,Config *config)

{
  _Rb_tree_header *p_Var1;
  Protocol PVar2;
  
  Engine::Engine(&this->super_Engine,config);
  (this->super_Engine).super_Player.super_Obj._vptr_Obj = (_func_int **)&PTR__JsonEngine_001c0710;
  (this->super_Engine).super_Player.super_Tickable._vptr_Tickable = (_func_int **)&DAT_001c0838;
  this->jsonstate = none;
  *(undefined8 *)&(this->taskComplete).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->taskComplete).super__Function_base._M_functor + 8) = 0;
  (this->taskComplete).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->taskComplete)._M_invoker = (_Invoker_type)0x0;
  this->tick_test_period = 0x18;
  this->tick_test_period_wb = 0x32;
  this->tick_test = 0;
  this->tryNum = 3;
  this->engine = (Engine *)0x0;
  EngineProfile::EngineProfile(&(this->uciEngine).super_EngineProfile);
  (this->uciEngine).super_EngineProfile.super_Engine.super_Player.super_Obj._vptr_Obj =
       (_func_int **)&PTR__EngineProfile_001c0328;
  (this->uciEngine).super_EngineProfile.super_Engine.super_Player.super_Tickable._vptr_Tickable =
       (_func_int **)&PTR__UciEngine_001c0460;
  (this->uciEngine).expectingBestmove = false;
  EngineProfile::EngineProfile(&(this->wbEngine).super_EngineProfile);
  (this->wbEngine).super_EngineProfile.super_Engine.super_Player.super_Obj._vptr_Obj =
       (_func_int **)&PTR__WbEngine_001c0950;
  (this->wbEngine).super_EngineProfile.super_Engine.super_Player.super_Tickable._vptr_Tickable =
       (_func_int **)&PTR__WbEngine_001c0a80;
  p_Var1 = &(this->wbEngine).featureMap._M_t._M_impl.super__Rb_tree_header;
  (this->wbEngine).featureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->wbEngine).featureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->wbEngine).featureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->wbEngine).featureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->wbEngine).featureMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->wbEngine).pingCnt = 0;
  (this->wbEngine).expectingPongCnt = 0;
  (this->wbEngine).pongCnt = 0;
  (this->wbEngine).tick_delay_2_ready = -1;
  (this->wbEngine).feature_san = false;
  (this->wbEngine).feature_usermove = false;
  (this->wbEngine).feature_ping = false;
  (this->wbEngine).feature_done_finished = true;
  (this->wbEngine).syncMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->wbEngine).syncMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->wbEngine).syncMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->wbEngine).syncMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->wbEngine).syncMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->wbEngine).syncTasks.
  super__Vector_base<banksia::WbEngine::SyncTask,_std::allocator<banksia::WbEngine::SyncTask>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->wbEngine).syncTasks.
  super__Vector_base<banksia::WbEngine::SyncTask,_std::allocator<banksia::WbEngine::SyncTask>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->wbEngine).syncTasks.
  super__Vector_base<banksia::WbEngine::SyncTask,_std::allocator<banksia::WbEngine::SyncTask>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->usedCmdSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PVar2 = config->protocol;
  this->originalProtocol = PVar2;
  if (PVar2 == none) {
    (this->super_Engine).config.protocol = uci;
  }
  return;
}

Assistant:

JsonEngine::JsonEngine(const Config& config)
: Engine(config)
{
    assert(!config.command.empty());
    
    originalProtocol = config.protocol;
    if (config.protocol == Protocol::none) {
        this->config.protocol = Protocol::uci;
    }
}